

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

iterator __thiscall
cs::tree_type<cs::token_base_*>::erase_right(tree_type<cs::token_base_*> *this,iterator it)

{
  bool bVar1;
  error *this_00;
  tree_node *in_RSI;
  string *in_stack_ffffffffffffff98;
  tree_node *in_stack_ffffffffffffffa0;
  allocator local_39;
  string local_38 [40];
  iterator local_10 [2];
  
  local_10[0].mData = in_RSI;
  bVar1 = iterator::usable(local_10);
  if (!bVar1) {
    this_00 = (error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"E000E",&local_39);
    cov::error::error(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
  }
  destroy(in_stack_ffffffffffffffa0);
  (local_10[0].mData)->right = (tree_node *)0x0;
  return (iterator)local_10[0].mData;
}

Assistant:

iterator erase_right(iterator it)
		{
			if (!it.usable())
				throw cov::error("E000E");
			destroy(it.mData->right);
			it.mData->right = nullptr;
			return it;
		}